

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmax_distance.cpp
# Opt level: O0

void __thiscall
KMaxDistance::addFirstPathToNodeAVL
          (KMaxDistance *this,MaxRec *srcRec,int idxOfDstNode,double edgeCost,int numDistMaxs,
          MaxRec **maxs,NodeAVL **queue)

{
  MaxRec *dst;
  NodeAVL *pNVar1;
  int in_EDX;
  void *in_RSI;
  KMaxDistance *in_R8;
  MaxRec *in_R9;
  MaxRec *tmpRec;
  
  dst = createNewMaxRec(in_R8,(int)((ulong)in_R9 >> 0x20),(int)in_R9);
  copyVals(in_R8,in_R9,dst);
  modifyDstMaxs(in_R8,in_R9,(double)dst);
  dst->back = in_RSI;
  pNVar1 = avlInsert((NodeAVL **)in_R8,(double)in_R9,dst);
  dst->qPtr = pNVar1;
  *(MaxRec **)(&in_R8->numMaxRecs + (long)in_EDX * 2) = dst;
  return;
}

Assistant:

void KMaxDistance::addFirstPathToNodeAVL( MaxRec *srcRec, const int idxOfDstNode, const double edgeCost,
    const int numDistMaxs, MaxRec **maxs, NodeAVL **queue ){

    MaxRec *tmpRec = (MaxRec*)createNewMaxRec( idxOfDstNode, numDistMaxs );
    copyVals( srcRec, tmpRec );
    modifyDstMaxs( tmpRec, edgeCost );
    //tmpRec->back = srcRec->imgIdx;
    tmpRec->back = srcRec;
    tmpRec->qPtr = avlInsert( queue, tmpRec->sumVals, tmpRec );
    maxs[idxOfDstNode] = tmpRec;
}